

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_DXT.c
# Opt level: O3

uchar * convert_image_to_DXT1(uchar *uncompressed,int width,int height,int channels,int *out_size)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  uchar *puVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  uchar *puVar21;
  long lVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  long lVar26;
  int iVar27;
  int iVar28;
  uchar cblock [8];
  uchar ublock [48];
  int local_e4;
  undefined8 local_70;
  uchar local_68 [56];
  
  *out_size = 0;
  if (channels - 5U < 0xfffffffc || (uncompressed == (uchar *)0x0 || (height < 1 || width < 1))) {
    puVar5 = (uchar *)0x0;
  }
  else {
    uVar12 = (uint)(2U < (uint)channels);
    uVar10 = (width * 2 + 6U & 0xfffffff8) * (height + 3U >> 2);
    *out_size = uVar10;
    puVar5 = (uchar *)malloc((ulong)uVar10);
    iVar8 = 0;
    iVar13 = channels * width;
    iVar14 = iVar13 * 4;
    iVar2 = channels * 4;
    iVar20 = (uint)(2U < (uint)channels) * 2;
    iVar15 = 0;
    lVar22 = 0;
    do {
      iVar23 = height - iVar15;
      iVar15 = iVar15 + 4;
      iVar24 = iVar23;
      if (iVar15 < height) {
        iVar24 = 4;
      }
      iVar17 = iVar20;
      local_e4 = width + -1;
      uVar10 = uVar12;
      iVar19 = iVar8;
      iVar6 = 0;
      do {
        iVar1 = iVar6 + 4;
        iVar7 = iVar23;
        if (iVar24 < 1) {
          iVar4 = 0;
LAB_0015d86d:
          do {
            lVar9 = (long)iVar4;
            lVar26 = 0;
            do {
              local_68[lVar26 + lVar9] = local_68[0];
              local_68[lVar26 + lVar9 + 1] = local_68[1];
              local_68[lVar26 + lVar9 + 2] = local_68[2];
              lVar26 = lVar26 + 3;
            } while ((int)lVar26 != 0xc);
            iVar4 = iVar4 + 0xc;
            bVar3 = iVar7 < 3;
            iVar7 = iVar7 + 1;
          } while (bVar3);
        }
        else {
          iVar6 = width - iVar6;
          if (iVar1 < width) {
            iVar6 = 4;
          }
          lVar9 = 0;
          iVar4 = 0;
          iVar16 = iVar17;
          uVar11 = uVar10;
          iVar18 = iVar19;
          do {
            if (iVar6 < 1) {
LAB_0015d805:
              puVar21 = local_68 + (long)iVar4 + 2;
              iVar27 = local_e4;
              do {
                puVar21[-2] = local_68[0];
                puVar21[-1] = local_68[1];
                *puVar21 = local_68[2];
                puVar21 = puVar21 + 3;
                iVar4 = iVar4 + 3;
                iVar27 = iVar27 + 1;
              } while (iVar27 < 3);
            }
            else {
              puVar21 = local_68 + (long)iVar4 + 2;
              lVar26 = 0;
              iVar27 = iVar16;
              uVar25 = uVar11;
              iVar28 = iVar18;
              do {
                puVar21[-2] = uncompressed[iVar28];
                puVar21[-1] = uncompressed[(int)uVar25];
                *puVar21 = uncompressed[iVar27];
                lVar26 = lVar26 + 1;
                iVar28 = iVar28 + channels;
                iVar27 = iVar27 + channels;
                uVar25 = uVar25 + channels;
                puVar21 = puVar21 + 3;
                iVar4 = iVar4 + 3;
              } while (lVar26 < iVar6);
              if (iVar6 < 4) goto LAB_0015d805;
            }
            lVar9 = lVar9 + 1;
            iVar18 = iVar18 + iVar13;
            iVar16 = iVar16 + iVar13;
            uVar11 = uVar11 + iVar13;
          } while (lVar9 < iVar24);
          if (iVar24 < 4) goto LAB_0015d86d;
        }
        compress_DDS_color_block(3,local_68,(uchar *)&local_70);
        *(undefined8 *)(puVar5 + (int)lVar22) = local_70;
        lVar22 = (long)(int)lVar22 + 8;
        iVar19 = iVar19 + iVar2;
        iVar17 = iVar17 + iVar2;
        uVar10 = uVar10 + iVar2;
        local_e4 = local_e4 + -4;
        iVar6 = iVar1;
      } while (iVar1 < width);
      iVar8 = iVar8 + iVar14;
      iVar20 = iVar20 + iVar14;
      uVar12 = uVar12 + iVar14;
    } while (iVar15 < height);
  }
  return puVar5;
}

Assistant:

unsigned char* convert_image_to_DXT1(
		const unsigned char *const uncompressed,
		int width, int height, int channels,
		int *out_size )
{
	unsigned char *compressed;
	int i, j, x, y;
	unsigned char ublock[16*3];
	unsigned char cblock[8];
	int index = 0, chan_step = 1;
	int block_count = 0;
	/*	error check	*/
	*out_size = 0;
	if( (width < 1) || (height < 1) ||
		(NULL == uncompressed) ||
		(channels < 1) || (channels > 4) )
	{
		return NULL;
	}
	/*	for channels == 1 or 2, I do not step forward for R,G,B values	*/
	if( channels < 3 )
	{
		chan_step = 0;
	}
	/*	get the RAM for the compressed image
		(8 bytes per 4x4 pixel block)	*/
	*out_size = ((width+3) >> 2) * ((height+3) >> 2) * 8;
	compressed = (unsigned char*)malloc( *out_size );
	/*	go through each block	*/
	for( j = 0; j < height; j += 4 )
	{
		for( i = 0; i < width; i += 4 )
		{
			/*	copy this block into a new one	*/
			int idx = 0;
			int mx = 4, my = 4;
			if( j+4 >= height )
			{
				my = height - j;
			}
			if( i+4 >= width )
			{
				mx = width - i;
			}
			for( y = 0; y < my; ++y )
			{
				for( x = 0; x < mx; ++x )
				{
					ublock[idx++] = uncompressed[(j+y)*width*channels+(i+x)*channels];
					ublock[idx++] = uncompressed[(j+y)*width*channels+(i+x)*channels+chan_step];
					ublock[idx++] = uncompressed[(j+y)*width*channels+(i+x)*channels+chan_step+chan_step];
				}
				for( x = mx; x < 4; ++x )
				{
					ublock[idx++] = ublock[0];
					ublock[idx++] = ublock[1];
					ublock[idx++] = ublock[2];
				}
			}
			for( y = my; y < 4; ++y )
			{
				for( x = 0; x < 4; ++x )
				{
					ublock[idx++] = ublock[0];
					ublock[idx++] = ublock[1];
					ublock[idx++] = ublock[2];
				}
			}
			/*	compress the block	*/
			++block_count;
			compress_DDS_color_block( 3, ublock, cblock );
			/*	copy the data from the block into the main block	*/
			for( x = 0; x < 8; ++x )
			{
				compressed[index++] = cblock[x];
			}
		}
	}
	return compressed;
}